

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommychain.h
# Opt level: O0

void tommy_chain_mergesort(tommy_chain *chain,undefined1 *cmp)

{
  long lVar1;
  tommy_node *ptVar2;
  tommy_node_struct *ptVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  tommy_chain *ptVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  bool bVar9;
  tommy_node **local_268;
  tommy_chain *last;
  tommy_node *next;
  tommy_count_t i;
  tommy_count_t mask;
  tommy_node *tail;
  tommy_node *node;
  tommy_count_t counter;
  undefined1 *cmp_local;
  tommy_chain *chain_local;
  tommy_chain bit [33];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ptVar2 = chain->tail;
  node._4_4_ = 0;
  tail = chain->head;
  do {
    ptVar7 = bit + 0x1f;
    bit[0x1f].tail = tail;
    bit[0x20].head = tail;
    ptVar3 = tail->next;
    next._0_4_ = 0;
    for (next._4_4_ = node._4_4_; local_268 = &ptVar7->tail, (next._4_4_ & 1) != 0;
        next._4_4_ = next._4_4_ >> 1) {
      tommy_chain_merge_degenerated
                ((tommy_chain *)&bit[(ulong)(tommy_uint_t)next - 1].tail,(tommy_chain *)local_268,
                 cmp);
      ptVar7 = bit + ((ulong)(tommy_uint_t)next - 1);
      next._0_4_ = (tommy_uint_t)next + 1;
    }
    bit[(ulong)(tommy_uint_t)next - 1].tail = *local_268;
    bit[(tommy_uint_t)next].head = local_268[1];
    node._4_4_ = node._4_4_ + 1;
    bVar9 = tail != ptVar2;
    tail = ptVar3;
  } while (bVar9);
  next._0_4_ = tommy_ctz_u32(node._4_4_);
  next._4_4_ = node._4_4_ >> ((byte)(tommy_uint_t)next & 0x1f);
  while (next._4_4_ != 1) {
    next._4_4_ = next._4_4_ >> 1;
    if ((next._4_4_ & 1) == 0) {
      bit[(ulong)((tommy_uint_t)next + 1) - 1].tail = bit[(ulong)(tommy_uint_t)next - 1].tail;
      bit[(tommy_uint_t)next + 1].head = bit[(tommy_uint_t)next].head;
    }
    else {
      tommy_chain_merge_degenerated
                ((tommy_chain *)&bit[(ulong)((tommy_uint_t)next + 1) - 1].tail,
                 (tommy_chain *)&bit[(ulong)(tommy_uint_t)next - 1].tail,cmp);
    }
    next._0_4_ = (tommy_uint_t)next + 1;
  }
  uVar8 = (ulong)(tommy_uint_t)next;
  uVar4 = *(undefined4 *)((long)&bit[uVar8 - 1].tail + 4);
  uVar5 = *(undefined4 *)&bit[uVar8].head;
  uVar6 = *(undefined4 *)((long)&bit[uVar8].head + 4);
  *(undefined4 *)&chain->head = *(undefined4 *)&bit[uVar8 - 1].tail;
  *(undefined4 *)((long)&chain->head + 4) = uVar4;
  *(undefined4 *)&chain->tail = uVar5;
  *(undefined4 *)((long)&chain->tail + 4) = uVar6;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

tommy_inline void tommy_chain_mergesort(tommy_chain* chain, tommy_compare_func* cmp)
{
	/*
	 * Bit buckets of chains.
	 * Each bucket contains 2^i nodes or it's empty.
	 * The chain at address TOMMY_CHAIN_BIT_MAX is an independet variable operating as "carry".
	 * We keep it in the same "bit" vector to avoid reports from the valgrind tool sgcheck.
	 */
	tommy_chain bit[TOMMY_CHAIN_BIT_MAX + 1];

	/**
	 * Value stored inside the bit bucket.
	 * It's used to know which bucket is empty of full.
	 */
	tommy_count_t counter;
	tommy_node* node = chain->head;
	tommy_node* tail = chain->tail;
	tommy_count_t mask;
	tommy_count_t i;

	counter = 0;
	while (1) {
		tommy_node* next;
		tommy_chain* last;

		/* carry bit to add */
		last = &bit[TOMMY_CHAIN_BIT_MAX];
		bit[TOMMY_CHAIN_BIT_MAX].head = node;
		bit[TOMMY_CHAIN_BIT_MAX].tail = node;
		next = node->next;

		/* add the bit, propagating the carry */
		i = 0;
		mask = counter;
		while ((mask & 1) != 0) {
			tommy_chain_merge_degenerated(&bit[i], last, cmp);
			mask >>= 1;
			last = &bit[i];
			++i;
		}

		/* copy the carry in the first empty bit */
		bit[i] = *last;

		/* add the carry in the counter */
		++counter;

		if (node == tail)
			break;
		node = next;
	}

	/* merge the buckets */
	i = tommy_ctz_u32(counter);
	mask = counter >> i;
	while (mask != 1) {
		mask >>= 1;
		if (mask & 1)
			tommy_chain_merge_degenerated(&bit[i + 1], &bit[i], cmp);
		else
			bit[i + 1] = bit[i];
		++i;
	}

	*chain = bit[i];
}